

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_scanner_tokenAsCharacter(sysbvm_context_t *context,size_t stringSize,uint8_t *string)

{
  uint8_t uVar1;
  uint8_t *string_local;
  size_t stringSize_local;
  sysbvm_context_t *context_local;
  
  if (stringSize < 2) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/scanner.c:72: assertion failure: stringSize >= 2"
              );
  }
  if (stringSize == 2) {
    context_local = (sysbvm_context_t *)sysbvm_tuple_char32_encode(context,0);
  }
  else if ((stringSize < 4) || (string[1] != '\\')) {
    context_local = (sysbvm_context_t *)sysbvm_tuple_char32_encode(context,(uint)string[1]);
  }
  else {
    uVar1 = string[2];
    if (uVar1 == 'n') {
      context_local = (sysbvm_context_t *)sysbvm_tuple_char32_encode(context,10);
    }
    else if (uVar1 == 'r') {
      context_local = (sysbvm_context_t *)sysbvm_tuple_char32_encode(context,0xd);
    }
    else if (uVar1 == 't') {
      context_local = (sysbvm_context_t *)sysbvm_tuple_char32_encode(context,9);
    }
    else {
      context_local = (sysbvm_context_t *)sysbvm_tuple_char32_encode(context,(uint)string[2]);
    }
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_scanner_tokenAsCharacter(sysbvm_context_t *context, size_t stringSize, const uint8_t *string)
{
    SYSBVM_ASSERT(stringSize >= 2);
    if(stringSize == 2)
    {
        return sysbvm_tuple_char32_encode(context, 0);
    }
    else if(stringSize >= 4 && string[1] == '\\')
    {
        switch(string[2])
        {
        case 't': return sysbvm_tuple_char32_encode(context, '\t');
        case 'r': return sysbvm_tuple_char32_encode(context, '\r');
        case 'n': return sysbvm_tuple_char32_encode(context, '\n');
        default: return sysbvm_tuple_char32_encode(context, string[2]);
        }
    }
    else
    {
        return sysbvm_tuple_char32_encode(context, string[1]);
    }
}